

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerProfiledLdElemI(Lowerer *this,JitProfilingInstr *instr)

{
  LowererMD *this_00;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  AddrOpnd *pAVar8;
  IndirOpnd *this_01;
  RegOpnd *opndArg;
  HelperCallOpnd *this_02;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2337,"(instr)","instr");
    if (!bVar3) goto LAB_005d76a3;
    *puVar6 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  this_00 = &this->m_lowererMD;
  pIVar7 = IR::IntConstOpnd::New(0,TyInt8,pFVar1,false);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar7->super_Opnd);
  pIVar7 = IR::IntConstOpnd::New(0,TyInt8,pFVar1,false);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar7->super_Opnd);
  pIVar7 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,pFVar1);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pIVar7->super_Opnd);
  pAVar8 = CreateFunctionBodyOpnd(this,pFVar1);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pAVar8->super_Opnd);
  this_01 = (IndirOpnd *)IR::Instr::UnlinkSrc1(&instr->super_Instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005d76a3;
    *puVar6 = 0;
  }
  pAVar8 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_01);
  if (pAVar8 == (AddrOpnd *)0x0) {
    if (this_01->m_offset < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x234b,
                         "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                         ,
                         "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                        );
      if (!bVar3) goto LAB_005d76a3;
      *puVar6 = 0;
    }
    pAVar8 = IR::AddrOpnd::New((Var)((ulong)(uint)this_01->m_offset | 0x1000000000000),
                               AddrOpndKindDynamicVar,pFVar1,false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&pAVar8->super_Opnd);
  opndArg = IR::IndirOpnd::UnlinkBaseOpnd(this_01);
  LowererMD::LoadHelperArgument(this_00,&instr->super_Instr,&opndArg->super_Opnd);
  IR::Opnd::Free((Opnd *)this_01,pFVar1);
  this_02 = IR::HelperCallOpnd::New(HelperProfiledLdElem,pFVar1);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005d76a3;
    *puVar6 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_02->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005d76a3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar5 = (this_02->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_02 = (HelperCallOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar1);
    bVar5 = (this_02->super_Opnd).field_0xb;
  }
  (this_02->super_Opnd).field_0xb = bVar5 | 2;
  (instr->super_Instr).m_src1 = &this_02->super_Opnd;
  LowererMD::LowerCall(this_00,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledLdElemI(IR::JitProfilingInstr *const instr)
{
    Assert(instr);

    /*
        Var ProfilingHelpers::ProfiledLdElem(
            const Var base,
            const Var varIndex,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    IR::IndirOpnd *const indir = instr->UnlinkSrc1()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledLdElem, func));
    m_lowererMD.LowerCall(instr, 0);
}